

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void __thiscall Liby::TimerQueue::insert(TimerQueue *this,shared_ptr<Liby::Timer> *timer)

{
  WeakTimerHolder weakTimerHolder;
  WeakTimerHolder WStack_58;
  
  WeakTimerHolder::WeakTimerHolder(&WStack_58,timer);
  if ((this->queue_).size_ == 0) {
    updateTimerfd(this,&((timer->super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                        )->timeout_);
  }
  BinaryHeap<Liby::WeakTimerHolder>::insert(&this->queue_,&WStack_58);
  WeakTimerHolder::~WeakTimerHolder(&WStack_58);
  return;
}

Assistant:

void TimerQueue::insert(const std::shared_ptr<Timer> &timer) {
    WeakTimerHolder weakTimerHolder(timer);
    if (queue_.empty()) {
        updateTimerfd(timer->timeout());
    }
    queue_.insert(weakTimerHolder);
}